

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::EmptyStatementSyntax::setChild
          (EmptyStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  NamedLabelSyntax *pNVar10;
  
  if (index == 2) {
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar5 = pvVar9->field_0x2;
    NVar6.raw = (pvVar9->numFlags).raw;
    uVar7 = pvVar9->rawLen;
    pIVar3 = pvVar9->info;
    (this->semicolon).kind = pvVar9->kind;
    (this->semicolon).field_0x2 = uVar5;
    (this->semicolon).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->semicolon).rawLen = uVar7;
    (this->semicolon).info = pIVar3;
  }
  else if (index == 1) {
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar1 = *ppSVar8;
    uVar4 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         pSVar1->kind;
    *(undefined4 *)
     &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
         uVar4;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
         pSVar1->previewNode;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar1[1].parent;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar2;
  }
  else {
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar8 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar10 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar10 = (NamedLabelSyntax *)*ppSVar8;
    }
    (this->super_StatementSyntax).label = pNVar10;
  }
  return;
}

Assistant:

void EmptyStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: semicolon = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}